

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.h
# Opt level: O1

uint __thiscall lzham::lzcompressor::lzdecision::get_match_dist(lzdecision *this,state *cur_state)

{
  uint uVar1;
  
  if (this->m_len < 1) {
    return 0;
  }
  uVar1 = this->m_dist;
  if (-1 < (int)uVar1) {
    return uVar1;
  }
  return (cur_state->super_state_base).m_match_hist[~uVar1];
}

Assistant:

inline bool is_rep() const { return m_dist < 0; }